

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonClassBase<cfd::js::api::json::GetExtkeyInfoRequest>::Deserialize
          (JsonClassBase<cfd::js::api::json::GetExtkeyInfoRequest> *this,string *value)

{
  size_t in_RCX;
  void *__buf;
  undefined1 local_70 [8];
  UniValue object;
  string *value_local;
  JsonClassBase<cfd::js::api::json::GetExtkeyInfoRequest> *this_local;
  
  object.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  UniValue::UniValue((UniValue *)local_70);
  UniValue::read((UniValue *)local_70,
                 (int)object.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,__buf,in_RCX);
  (*this->_vptr_JsonClassBase[8])(this,local_70);
  UniValue::~UniValue((UniValue *)local_70);
  return;
}

Assistant:

virtual void Deserialize(const std::string& value) {
    UniValue object;
    object.read(value);
    DeserializeUniValue(object);
  }